

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

void ImGui::TabBarQueueChangeTabOrder(ImGuiTabBar *tab_bar,ImGuiTabItem *tab,int dir)

{
  if ((dir != -1) && (dir != 1)) {
    __assert_fail("dir == -1 || dir == +1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JacquesLucke[P]gate_sim/extern/imgui/imgui_widgets.cpp"
                  ,0x1abe,
                  "void ImGui::TabBarQueueChangeTabOrder(ImGuiTabBar *, const ImGuiTabItem *, int)")
    ;
  }
  if (tab_bar->ReorderRequestTabId == 0) {
    tab_bar->ReorderRequestTabId = tab->ID;
    tab_bar->ReorderRequestDir = (ImS8)dir;
    return;
  }
  __assert_fail("tab_bar->ReorderRequestTabId == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JacquesLucke[P]gate_sim/extern/imgui/imgui_widgets.cpp"
                ,0x1abf,
                "void ImGui::TabBarQueueChangeTabOrder(ImGuiTabBar *, const ImGuiTabItem *, int)");
}

Assistant:

void ImGui::TabBarQueueChangeTabOrder(ImGuiTabBar* tab_bar, const ImGuiTabItem* tab, int dir)
{
    IM_ASSERT(dir == -1 || dir == +1);
    IM_ASSERT(tab_bar->ReorderRequestTabId == 0);
    tab_bar->ReorderRequestTabId = tab->ID;
    tab_bar->ReorderRequestDir = (ImS8)dir;
}